

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# build_log.cc
# Opt level: O0

bool __thiscall BuildLog::OpenForWrite(BuildLog *this,string *path,BuildLogUser *user,string *err)

{
  bool bVar1;
  string *err_local;
  BuildLogUser *user_local;
  string *path_local;
  BuildLog *this_local;
  
  if (((this->needs_recompaction_ & 1U) == 0) || (bVar1 = Recompact(this,path,user,err), bVar1)) {
    if (this->log_file_ != (FILE *)0x0) {
      __assert_fail("!log_file_",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/build_log.cc"
                    ,0x8a,
                    "bool BuildLog::OpenForWrite(const string &, const BuildLogUser &, string *)");
    }
    std::__cxx11::string::operator=((string *)&this->log_file_path_,(string *)path);
    this_local._7_1_ = true;
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool BuildLog::OpenForWrite(const string& path, const BuildLogUser& user,
                            string* err) {
  if (needs_recompaction_) {
    if (!Recompact(path, user, err))
      return false;
  }

  assert(!log_file_);
  log_file_path_ = path;  // we don't actually open the file right now, but will
                          // do so on the first write attempt
  return true;
}